

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.c
# Opt level: O3

Qiniu_Digest * Qiniu_Digest_New(Qiniu_Digest_Type digest_type)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  char *pcVar2;
  EVP_MD *type;
  Qiniu_Digest *pQVar3;
  char *name;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx != (EVP_MD_CTX *)0x0) {
    pcVar2 = (char *)0x0;
    if (digest_type == QINIU_DIGEST_TYPE_MD5) {
      pcVar2 = "md5";
    }
    name = "sha1";
    if (digest_type != QINIU_DIGEST_TYPE_SHA1) {
      name = pcVar2;
    }
    type = EVP_get_digestbyname(name);
    if (type != (EVP_MD *)0x0) {
      iVar1 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
      if (iVar1 == 0) {
        return (Qiniu_Digest *)0x0;
      }
      pQVar3 = (Qiniu_Digest *)malloc(8);
      if (pQVar3 != (Qiniu_Digest *)0x0) {
        pQVar3->md_ctx = (EVP_MD_CTX *)ctx;
        return pQVar3;
      }
    }
    EVP_MD_CTX_free(ctx);
  }
  return (Qiniu_Digest *)0x0;
}

Assistant:

Qiniu_Digest *Qiniu_Digest_New(Qiniu_Digest_Type digest_type)
{

	EVP_MD_CTX *md_ctx = EVP_MD_CTX_new();
	if (md_ctx == NULL) {
		return NULL;
	}
	const EVP_MD* md = EVP_get_digestbyname(Qiniu_Digest_Type_To_Name(digest_type));
	if (md == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	if (EVP_DigestInit_ex(md_ctx, md, NULL) == 0) {
		return NULL;
	}
	Qiniu_Digest *digest = malloc(sizeof(Qiniu_Digest));
	if (digest == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	memset(digest, 0, sizeof(Qiniu_Digest));
	digest->md_ctx = md_ctx;
	return digest;
}